

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

int iq1_find_best_neighbour2
              (uint16_t *neighbours,uint64_t *grid,float *xval,float *weight,float scale,float *xg,
              int8_t *L,int ngrid)

{
  ushort *puVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  long in_RCX;
  long in_RDX;
  ulong uVar5;
  long in_RSI;
  ushort *in_RDI;
  long in_R8;
  long in_R9;
  float in_XMM0_Da;
  float fVar6;
  int in_stack_00000008;
  int i_3;
  int8_t *pg;
  float w_2;
  float q_2;
  int i_2;
  float sumq2;
  float sumqx;
  int8_t *pg_2;
  int j_2;
  float diff_1;
  float q_1;
  float w_1;
  int j_1;
  float d2_1;
  int8_t *grid_i;
  int i_1;
  float diff;
  float w;
  float q;
  int i;
  float d2;
  int8_t *pg_1;
  int j;
  int grid_index;
  float best_score;
  int num_neighbors;
  int local_b4;
  int local_9c;
  float local_98;
  float local_94;
  uint local_88;
  int local_78;
  float local_74;
  uint local_68;
  int local_58;
  float local_54;
  int local_48;
  uint local_44;
  float local_40;
  
  uVar3 = (uint)*in_RDI;
  if (uVar3 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-quants.c"
               ,0xfd6,"GGML_ASSERT(%s) failed","num_neighbors > 0");
  }
  local_40 = 3.4028235e+38;
  local_44 = 0xffffffff;
  for (local_48 = 1; local_48 <= (int)uVar3; local_48 = local_48 + 1) {
    local_54 = 0.0;
    for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
      fVar6 = in_XMM0_Da *
              *(float *)(in_R8 + (long)((*(char *)(in_RSI + (long)(int)(uint)in_RDI[local_48] * 8 +
                                                  (long)local_58) + -1) / 2) * 4) +
              -*(float *)(in_RDX + (long)local_58 * 4);
      local_54 = *(float *)(in_RCX + (long)local_58 * 4) * fVar6 * fVar6 + local_54;
    }
    if (local_54 < local_40) {
      local_40 = local_54;
      local_44 = (uint)in_RDI[local_48];
    }
  }
  if ((int)local_44 < 0) {
    for (local_68 = 0; (int)local_68 < in_stack_00000008; local_68 = local_68 + 1) {
      local_74 = 0.0;
      for (local_78 = 0; local_78 < 8; local_78 = local_78 + 1) {
        fVar6 = in_XMM0_Da *
                *(float *)(in_R8 + (long)((*(char *)(in_RSI + (long)(int)local_68 * 8 +
                                                    (long)local_78) + -1) / 2) * 4) +
                -*(float *)(in_RDX + (long)(int)local_68 * 4);
        local_74 = *(float *)(in_RCX + (long)local_78 * 4) * fVar6 * fVar6 + local_74;
      }
      if (local_74 < local_40) {
        local_40 = local_74;
        local_44 = local_68;
      }
    }
  }
  if ((int)local_44 < 0) {
    printf("Oops, did not find grid point\n");
    printf("Have %d neighbours\n",(ulong)uVar3);
    for (local_88 = 1; (int)local_88 <= (int)uVar3; local_88 = local_88 + 1) {
      uVar5 = (ulong)(int)local_88;
      puVar1 = in_RDI + uVar5;
      local_94 = 0.0;
      local_98 = 0.0;
      for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
        iVar4 = *(char *)(in_RSI + (long)(int)(uint)*puVar1 * 8 + (long)local_9c) + -1;
        uVar5 = (long)iVar4 % 2 & 0xffffffff;
        fVar6 = *(float *)(in_R8 + (long)(iVar4 / 2) * 4);
        fVar2 = *(float *)(in_RCX + (long)local_9c * 4);
        local_94 = fVar2 * fVar6 * *(float *)(in_RDX + (long)local_9c * 4) + local_94;
        local_98 = fVar2 * fVar6 * fVar6 + local_98;
      }
      printf("    neighbour %d: sumqx = %g sumq2 = %g\n",(double)local_94,(double)local_98,
             (ulong)local_88,uVar5);
    }
  }
  if (-1 < (int)local_44) {
    for (local_b4 = 0; local_b4 < 8; local_b4 = local_b4 + 1) {
      *(char *)(in_R9 + local_b4) =
           (char)((long)(*(char *)(in_RSI + (long)(int)local_44 * 8 + (long)local_b4) + -1) / 2);
    }
    return local_44;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-quants.c"
             ,0x1006,"GGML_ASSERT(%s) failed","grid_index >= 0");
}

Assistant:

static int iq1_find_best_neighbour2(const uint16_t * GGML_RESTRICT neighbours, const uint64_t * GGML_RESTRICT grid,
        const float * GGML_RESTRICT xval, const float * GGML_RESTRICT weight, float scale, const float * GGML_RESTRICT xg, int8_t * GGML_RESTRICT L, int ngrid) {
    int num_neighbors = neighbours[0];
    GGML_ASSERT(num_neighbors > 0);
    float best_score = FLT_MAX;
    int grid_index = -1;
    for (int j = 1; j <= num_neighbors; ++j) {
        const int8_t * pg = (const int8_t *)(grid + neighbours[j]);
        float d2 = 0;
        for (int i = 0; i < 8; ++i) {
            float q = xg[(pg[i] - 1)/2];
            float w = weight[i];
            float diff = scale*q - xval[i];
            d2 += w*diff*diff;
        }
        if (d2 < best_score) {
            best_score = d2;
            grid_index = neighbours[j];
        }
    }
    if (grid_index < 0) {
        for (int i = 0; i < ngrid; ++i) {
            const int8_t * grid_i = (const int8_t *)(grid + i);
            float d2 = 0;
            for (int j = 0; j < 8; ++j) {
                float w = weight[j];
                float q = xg[(grid_i[j] - 1)/2];
                float diff = scale*q - xval[i];
                d2 += w*diff*diff;
            }
            if (d2 < best_score) {
                best_score = d2;
                grid_index = i;
            }
        }
    }
    if (grid_index < 0) {
        printf("Oops, did not find grid point\n");
        printf("Have %d neighbours\n", num_neighbors);
        for (int j = 1; j <= num_neighbors; ++j) {
            const int8_t * pg = (const int8_t *)(grid + neighbours[j]);
            float sumqx = 0, sumq2 = 0;
            for (int i = 0; i < 8; ++i) {
                float q = xg[(pg[i] - 1)/2];
                float w = weight[i];
                sumqx += w*q*xval[i];
                sumq2 += w*q*q;
            }
            printf("    neighbour %d: sumqx = %g sumq2 = %g\n", j, (double)sumqx, (double)sumq2);
        }
    }
    GGML_ASSERT(grid_index >= 0);
    const int8_t * pg = (const int8_t *)(grid + grid_index);
    for (int i = 0; i < 8; ++i) L[i] = (pg[i] - 1)/2;
    return grid_index;
}